

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

void ncnn::requantize_from_int32_to_int8
               (Mat *src,Mat *dst,Mat *scale_in_data,Mat *scale_out_data,Mat *bias_data,
               int activation_type,Mat *activation_params,Option *opt)

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  Layer *pLVar3;
  long lVar4;
  undefined8 uStack_148;
  undefined1 auStack_140 [8];
  undefined1 auStack_13c [8];
  undefined8 uStack_134;
  Mat *local_128;
  undefined1 local_120 [8];
  undefined1 auStack_11c [8];
  undefined8 uStack_114;
  Mat local_108;
  Mat local_c0;
  Mat local_78;
  
  auStack_140 = (undefined1  [8])0x16605b;
  local_128 = src;
  local_120 = (undefined1  [8])dst;
  pLVar3 = create_layer(0x3f);
  auStack_140 = (undefined1  [8])0x166069;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0x13c) + 4));
  auStack_140 = (undefined1  [8])0x166077;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0x13c) + 4),0,
                 scale_in_data->w);
  auStack_140 = (undefined1  [8])0x166087;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0x13c) + 4),1,
                 scale_out_data->w);
  auStack_140 = (undefined1  [8])0x166099;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0x13c) + 4),2,bias_data->w
                );
  auStack_140 = (undefined1  [8])0x1660a9;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0x13c) + 4),3,
                 activation_type);
  auStack_140 = (undefined1  [8])0x1660be;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0x13c) + 4),4,
                 activation_params);
  auStack_140 = (undefined1  [8])0x1660ca;
  (*pLVar3->_vptr_Layer[2])(pLVar3,(undefined1 *)((long)register0x00000020 + -0x13c) + 4);
  lVar4 = 0x40;
  do {
    *(undefined8 *)((long)&local_108.data + lVar4) = 0;
    *(undefined8 *)((long)&uStack_148 + lVar4) = 0;
    *(undefined8 *)(&stack0xfffffffffffffec0 + lVar4) = 0;
    *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0x13c) + lVar4) = 0;
    *(undefined8 *)((long)&uStack_134 + lVar4) = 0;
    *(undefined8 *)((long)&local_128 + lVar4) = 0;
    *(undefined8 *)(&stack0xfffffffffffffee0 + lVar4) = 0;
    *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0x11c) + lVar4) = 0;
    *(undefined8 *)((long)&uStack_114 + lVar4) = 0;
    lVar4 = lVar4 + 0x48;
  } while (lVar4 != 0x118);
  if (&local_108 != scale_in_data) {
    piVar1 = scale_in_data->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    if (local_108.refcount != (int *)0x0) {
      LOCK();
      *local_108.refcount = *local_108.refcount + -1;
      UNLOCK();
      if (*local_108.refcount == 0) {
        if (local_108.allocator == (Allocator *)0x0) {
          if (local_108.data != (void *)0x0) {
            auStack_140 = (undefined1  [8])0x16614c;
            free(local_108.data);
          }
        }
        else {
          auStack_140 = (undefined1  [8])0x16613d;
          (*(local_108.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_108.data = scale_in_data->data;
    local_108.refcount = scale_in_data->refcount;
    local_108.elemsize = scale_in_data->elemsize;
    local_108.elempack = scale_in_data->elempack;
    local_108.allocator = scale_in_data->allocator;
    local_108.dims = scale_in_data->dims;
    local_108.w = scale_in_data->w;
    local_108.h = scale_in_data->h;
    local_108.d = scale_in_data->d;
    local_108.c = scale_in_data->c;
    local_108.cstep = scale_in_data->cstep;
  }
  if (&local_c0 != scale_out_data) {
    piVar1 = scale_out_data->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    if (local_c0.refcount != (int *)0x0) {
      LOCK();
      *local_c0.refcount = *local_c0.refcount + -1;
      UNLOCK();
      if (*local_c0.refcount == 0) {
        if (local_c0.allocator == (Allocator *)0x0) {
          if (local_c0.data != (void *)0x0) {
            auStack_140 = (undefined1  [8])0x1661dd;
            free(local_c0.data);
          }
        }
        else {
          auStack_140 = (undefined1  [8])0x1661ce;
          (*(local_c0.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_c0.data = scale_out_data->data;
    local_c0.refcount = scale_out_data->refcount;
    local_c0.elemsize = scale_out_data->elemsize;
    local_c0.elempack = scale_out_data->elempack;
    local_c0.allocator = scale_out_data->allocator;
    local_c0.dims = scale_out_data->dims;
    local_c0.w = scale_out_data->w;
    local_c0.h = scale_out_data->h;
    local_c0.d = scale_out_data->d;
    local_c0.c = scale_out_data->c;
    local_c0.cstep = scale_out_data->cstep;
  }
  if (&local_78 != bias_data) {
    piVar1 = bias_data->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            auStack_140 = (undefined1  [8])0x166284;
            free(local_78.data);
          }
        }
        else {
          auStack_140 = (undefined1  [8])0x166275;
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_78.data = bias_data->data;
    local_78.refcount = bias_data->refcount;
    local_78.elemsize = bias_data->elemsize;
    local_78.elempack = bias_data->elempack;
    local_78.allocator = bias_data->allocator;
    local_78.dims = bias_data->dims;
    local_78.w = bias_data->w;
    local_78.h = bias_data->h;
    local_78.d = bias_data->d;
    local_78.c = bias_data->c;
    local_78.cstep = bias_data->cstep;
  }
  auStack_140 = (undefined1  [8])0x1662ed;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)((undefined1 *)((long)register0x00000020 + -0x11c) + 4),
             &local_108);
  auStack_140 = (undefined1  [8])0x1662fb;
  (*pLVar3->_vptr_Layer[3])(pLVar3,(undefined1 *)((long)register0x00000020 + -0x11c) + 4);
  auStack_140 = (undefined1  [8])0x166305;
  ModelBinFromMatArray::~ModelBinFromMatArray
            ((ModelBinFromMatArray *)((undefined1 *)((long)register0x00000020 + -0x11c) + 4));
  auStack_140 = (undefined1  [8])0x166311;
  (*pLVar3->_vptr_Layer[4])(pLVar3,opt);
  auStack_140 = (undefined1  [8])0x166327;
  (*pLVar3->_vptr_Layer[7])(pLVar3,local_128,local_120,opt);
  auStack_140 = (undefined1  [8])0x166333;
  (*pLVar3->_vptr_Layer[5])(pLVar3,opt);
  auStack_140 = (undefined1  [8])0x16633c;
  (*pLVar3->_vptr_Layer[1])(pLVar3);
  lVar4 = 0x90;
  do {
    piVar1 = *(int **)((long)&local_108.refcount + lVar4);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&local_108.data + lVar4);
        plVar2 = *(long **)((long)&local_108.allocator + lVar4);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            auStack_140 = (undefined1  [8])0x16637a;
            free(__ptr);
          }
        }
        else {
          auStack_140 = (undefined1  [8])0x166368;
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_108.cstep + lVar4) = 0;
    *(undefined8 *)((long)&local_108.refcount + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_108.elemsize + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_108.data + lVar4) = 0;
    *(undefined8 *)((long)&local_108.refcount + lVar4) = 0;
    *(undefined8 *)((long)&local_108.dims + lVar4) = 0;
    *(undefined8 *)((long)&local_108.h + lVar4) = 0;
    *(undefined4 *)((long)&local_108.c + lVar4) = 0;
    lVar4 = lVar4 + -0x48;
  } while (lVar4 != -0x48);
  auStack_140 = (undefined1  [8])0x1663b1;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0x13c) + 4));
  return;
}

Assistant:

void requantize_from_int32_to_int8(const Mat& src, Mat& dst, const Mat& scale_in_data, const Mat& scale_out_data, const Mat& bias_data, int activation_type, const Mat& activation_params, const Option& opt)
{
    Layer* requantize = create_layer(LayerType::Requantize);

    ParamDict pd;
    pd.set(0, scale_in_data.w);
    pd.set(1, scale_out_data.w);
    pd.set(2, bias_data.w);
    pd.set(3, activation_type);
    pd.set(4, activation_params);

    requantize->load_param(pd);

    Mat weights[3];
    weights[0] = scale_in_data;
    weights[1] = scale_out_data;
    weights[2] = bias_data;

    requantize->load_model(ModelBinFromMatArray(weights));

    requantize->create_pipeline(opt);

    requantize->forward(src, dst, opt);

    requantize->destroy_pipeline(opt);

    delete requantize;
}